

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

dgEdge * __thiscall dgPolyhedra::SpliteEdge(dgPolyhedra *this,HaI32 newIndex,dgEdge *edge)

{
  HaI32 HVar1;
  HaI32 v0;
  HaI32 v1;
  HaI32 HVar2;
  dgEdge *pdVar3;
  dgEdge *pdVar4;
  dgEdge *pdVar5;
  dgEdge *pdVar6;
  dgEdge *pdVar7;
  dgEdge *pdVar8;
  dgEdge *pdVar9;
  dgEdge *pdVar10;
  
  pdVar3 = edge->m_prev;
  pdVar4 = edge->m_next;
  HVar1 = edge->m_incidentFace;
  v0 = edge->m_incidentVertex;
  pdVar7 = edge->m_twin;
  pdVar5 = pdVar7->m_next;
  pdVar6 = pdVar7->m_prev;
  v1 = pdVar7->m_incidentVertex;
  HVar2 = pdVar7->m_incidentFace;
  DeleteEdge(this,edge);
  pdVar7 = AddHalfEdge(this,v0,newIndex);
  pdVar8 = AddHalfEdge(this,newIndex,v1);
  pdVar9 = AddHalfEdge(this,newIndex,v0);
  pdVar10 = AddHalfEdge(this,v1,newIndex);
  if (pdVar7 == (dgEdge *)0x0) {
    __assert_fail("edge0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0x830,"dgEdge *dgPolyhedra::SpliteEdge(hacd::HaI32, dgEdge *const)");
  }
  if (pdVar8 == (dgEdge *)0x0) {
    __assert_fail("edge1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0x831,"dgEdge *dgPolyhedra::SpliteEdge(hacd::HaI32, dgEdge *const)");
  }
  if (pdVar9 == (dgEdge *)0x0) {
    __assert_fail("twin0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0x832,"dgEdge *dgPolyhedra::SpliteEdge(hacd::HaI32, dgEdge *const)");
  }
  if (pdVar10 != (dgEdge *)0x0) {
    pdVar7->m_twin = pdVar9;
    pdVar9->m_twin = pdVar7;
    pdVar8->m_twin = pdVar10;
    pdVar10->m_twin = pdVar8;
    pdVar7->m_next = pdVar8;
    pdVar8->m_prev = pdVar7;
    pdVar10->m_next = pdVar9;
    pdVar9->m_prev = pdVar10;
    pdVar7->m_prev = pdVar3;
    pdVar3->m_next = pdVar7;
    pdVar8->m_next = pdVar4;
    pdVar4->m_prev = pdVar8;
    pdVar9->m_next = pdVar5;
    pdVar5->m_prev = pdVar9;
    pdVar10->m_prev = pdVar6;
    pdVar6->m_next = pdVar10;
    pdVar7->m_incidentFace = HVar1;
    pdVar8->m_incidentFace = HVar1;
    pdVar9->m_incidentFace = HVar2;
    pdVar10->m_incidentFace = HVar2;
    return pdVar7;
  }
  __assert_fail("twin1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                ,0x833,"dgEdge *dgPolyhedra::SpliteEdge(hacd::HaI32, dgEdge *const)");
}

Assistant:

dgEdge* dgPolyhedra::SpliteEdge (hacd::HaI32 newIndex,	dgEdge* const edge)
{
	dgEdge* const edge00 = edge->m_prev;
	dgEdge* const edge01 = edge->m_next;
	dgEdge* const twin00 = edge->m_twin->m_next;
	dgEdge* const twin01 = edge->m_twin->m_prev;

	hacd::HaI32 i0 = edge->m_incidentVertex;
	hacd::HaI32 i1 = edge->m_twin->m_incidentVertex;

	hacd::HaI32 f0 = edge->m_incidentFace;
	hacd::HaI32 f1 = edge->m_twin->m_incidentFace;

	DeleteEdge (edge);

	dgEdge* const edge0 = AddHalfEdge (i0, newIndex);
	dgEdge* const edge1 = AddHalfEdge (newIndex, i1);

	dgEdge* const twin0 = AddHalfEdge (newIndex, i0);
	dgEdge* const twin1 = AddHalfEdge (i1, newIndex);
	HACD_ASSERT (edge0);
	HACD_ASSERT (edge1);
	HACD_ASSERT (twin0);
	HACD_ASSERT (twin1);

	edge0->m_twin = twin0;
	twin0->m_twin = edge0;

	edge1->m_twin = twin1;
	twin1->m_twin = edge1;

	edge0->m_next = edge1;
	edge1->m_prev = edge0;

	twin1->m_next = twin0;
	twin0->m_prev = twin1;

	edge0->m_prev = edge00;
	edge00 ->m_next = edge0;

	edge1->m_next = edge01;
	edge01->m_prev = edge1;

	twin0->m_next = twin00;
	twin00->m_prev = twin0;

	twin1->m_prev = twin01;
	twin01->m_next = twin1;

	edge0->m_incidentFace = f0;
	edge1->m_incidentFace = f0;

	twin0->m_incidentFace = f1;
	twin1->m_incidentFace = f1;

#ifdef __ENABLE_SANITY_CHECK 
	//	HACD_ASSERT (SanityCheck ());
#endif

	return edge0;
}